

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlRegStrEqualWildcard(xmlChar *expStr,xmlChar *valStr)

{
  xmlChar *pxVar1;
  int iVar2;
  xmlChar *pxVar3;
  
  if (expStr == valStr) {
    iVar2 = 1;
  }
  else {
    iVar2 = 0;
    if (valStr != (xmlChar *)0x0 && expStr != (xmlChar *)0x0) {
      do {
        if (*expStr == *valStr) {
          valStr = valStr + 1;
        }
        else {
          pxVar3 = valStr;
          if (*valStr == '*') {
            pxVar3 = expStr;
            expStr = valStr;
          }
          if (*pxVar3 == '\0') {
            return 0;
          }
          if (*expStr != '*') {
            return 0;
          }
          do {
            valStr = pxVar3;
            if (*pxVar3 == '|') break;
            valStr = pxVar3 + 1;
            pxVar1 = pxVar3 + 1;
            pxVar3 = valStr;
          } while (*pxVar1 != '\0');
        }
        expStr = expStr + 1;
        if (*valStr == '\0') {
          return (int)(*expStr == '\0');
        }
      } while( true );
    }
  }
  return iVar2;
}

Assistant:

static int
xmlRegStrEqualWildcard(const xmlChar *expStr, const xmlChar *valStr) {
    if (expStr == valStr) return(1);
    if (expStr == NULL) return(0);
    if (valStr == NULL) return(0);
    do {
	/*
	* Eval if we have a wildcard for the current item.
	*/
        if (*expStr != *valStr) {
	    /* if one of them starts with a wildcard make valStr be it */
	    if (*valStr == '*') {
	        const xmlChar *tmp;

		tmp = valStr;
		valStr = expStr;
		expStr = tmp;
	    }
	    if ((*valStr != 0) && (*expStr != 0) && (*expStr++ == '*')) {
		do {
		    if (*valStr == XML_REG_STRING_SEPARATOR)
			break;
		    valStr++;
		} while (*valStr != 0);
		continue;
	    } else
		return(0);
	}
	expStr++;
	valStr++;
    } while (*valStr != 0);
    if (*expStr != 0)
	return (0);
    else
	return (1);
}